

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_motion(_glist *x,t_floatarg xpos,t_floatarg ypos,t_floatarg fmod)

{
  undefined1 *puVar1;
  t_editor *ptVar2;
  _instanceeditor *p_Var3;
  long lVar4;
  short sVar5;
  _clock *p_Var6;
  t_gobj *x_00;
  t_object *x_01;
  _glist *p_Var7;
  int in_R9D;
  uint ypos_00;
  uint xpos_00;
  float fVar8;
  int x11;
  int guifsize;
  int fheight;
  int fwidth;
  int y12;
  int x12;
  int y11;
  
  ptVar2 = x->gl_editor;
  if (ptVar2 == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  xpos_00 = (uint)xpos;
  ypos_00 = (uint)ypos;
  p_Var3 = (pd_maininstance.pd_gui)->i_editor;
  *(_glist **)(p_Var3 + 0x78) = x;
  *(uint *)(p_Var3 + 0x80) = xpos_00;
  *(uint *)(p_Var3 + 0x84) = ypos_00;
  switch(ptVar2->field_0x88 & 7) {
  case 1:
    if (ptVar2->e_clock == (_clock *)0x0) {
      p_Var6 = clock_new(x,delay_move);
      x->gl_editor->e_clock = p_Var6;
    }
    clock_unset(x->gl_editor->e_clock);
    clock_delay(x->gl_editor->e_clock,5.0);
    goto LAB_00142545;
  case 2:
    canvas_doconnect(x,xpos_00,ypos_00,(int)fmod,0);
LAB_00142545:
    ptVar2 = x->gl_editor;
    ptVar2->e_xnew = xpos_00;
    ptVar2->e_ynew = ypos_00;
    break;
  case 3:
    pdgui_vmess((char *)0x0,"crs iiii",x,"coords","x",(ulong)(uint)ptVar2->e_xwas,
                (ulong)(uint)ptVar2->e_ywas,(ulong)xpos_00,(ulong)ypos_00);
    break;
  case 4:
    if (ptVar2->e_motionfn == (t_glistmotionfn)0x0) {
      bug("e_motionfn");
    }
    ptVar2 = x->gl_editor;
    (*ptVar2->e_motionfn)
              (ptVar2->e_grab,xpos - (float)ptVar2->e_xwas,ypos - (float)ptVar2->e_ywas,0.0);
    ptVar2 = x->gl_editor;
    ptVar2->e_xwas = xpos_00;
    ptVar2->e_ywas = ypos_00;
    break;
  case 5:
    if (ptVar2->e_textedfor != (_rtext *)0x0) {
      rtext_mouse(ptVar2->e_textedfor,(int)(xpos - (float)ptVar2->e_xwas),
                  (int)(ypos - (float)ptVar2->e_ywas),2);
    }
    break;
  case 6:
    x11 = 0;
    y11 = 0;
    x12 = 0;
    y12 = 0;
    x_00 = canvas_findhitbox(x,ptVar2->e_xwas,ptVar2->e_ywas,&x11,&y11,&x12,&y12);
    if (x_00 == (t_gobj *)0x0) break;
    fVar8 = (float)x11;
    x_01 = pd_checkobject(&x_00->g_pd);
    if (x_01 == (t_object *)0x0) {
LAB_00142693:
      post("not resizable");
    }
    else {
      if (((((x_01->te_g).g_pd)->c_wb == &text_widgetbehavior) || ((~x_01->field_0x2e & 3) == 0)) ||
         ((p_Var7 = pd_checkglist((t_pd *)x_01), p_Var7 != (_glist *)0x0 &&
          ((x_01[4].te_xpix & 0x100) == 0)))) {
        text_getfont(x_01,x,&fwidth,&fheight,&guifsize);
        lVar4 = (long)(int)(xpos - fVar8) / (long)fwidth;
        sVar5 = (short)lVar4;
        if ((int)lVar4 < 2) {
          sVar5 = 1;
        }
        x_01->te_width = sVar5;
        gobj_vis(x_00,x,0);
      }
      else {
        if ((x_01->te_g).g_pd != canvas_class) goto LAB_00142693;
        gobj_vis(x_00,x,0);
        ptVar2 = x->gl_editor;
        *(int *)&x_01[1].te_inlet =
             (int)((float)*(int *)&x_01[1].te_inlet + (xpos - (float)ptVar2->e_xnew));
        *(int *)((long)&x_01[1].te_inlet + 4) =
             (int)((float)*(int *)((long)&x_01[1].te_inlet + 4) + (ypos - (float)ptVar2->e_ynew));
        ptVar2->e_xnew = xpos_00;
        ptVar2->e_ynew = ypos_00;
      }
      canvas_fixlinesfor(x,x_01);
      gobj_vis(x_00,x,1);
    }
    break;
  default:
    canvas_doclick(x,xpos_00,ypos_00,(int)fmod,0,in_R9D);
  }
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 | 8;
  return;
}

Assistant:

void canvas_motion(t_canvas *x, t_floatarg xpos, t_floatarg ypos,
    t_floatarg fmod)
{
#if 0
    post("motion %g %g %g", xpos, ypos, fmod);
#endif
    int mod = fmod;
    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }
    glist_setlastxy(x, xpos, ypos);
    if (x->gl_editor->e_onmotion == MA_MOVE)
    {
        if (!x->gl_editor->e_clock)
            x->gl_editor->e_clock = clock_new(x, (t_method)delay_move);
        clock_unset(x->gl_editor->e_clock);
        clock_delay(x->gl_editor->e_clock, 5);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_REGION)
        canvas_doregion(x, xpos, ypos, 0);
    else if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
        canvas_doconnect(x, xpos, ypos, mod, 0);
        x->gl_editor->e_xnew = xpos;
        x->gl_editor->e_ynew = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_PASSOUT)
    {
        if (!x->gl_editor->e_motionfn)
            bug("e_motionfn");
        (*x->gl_editor->e_motionfn)(&x->gl_editor->e_grab->g_pd,
            xpos - x->gl_editor->e_xwas, ypos - x->gl_editor->e_ywas, 0);
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
    }
    else if (x->gl_editor->e_onmotion == MA_DRAGTEXT)
    {
        t_rtext *rt = x->gl_editor->e_textedfor;
        if (rt)
            rtext_mouse(rt, xpos - x->gl_editor->e_xwas,
                ypos - x->gl_editor->e_ywas, RTEXT_DRAG);
    }
    else if (x->gl_editor->e_onmotion == MA_RESIZE)
    {
        int x11=0, y11=0, x12=0, y12=0;
        t_gobj *y1;
        if ((y1 = canvas_findhitbox(x,
            x->gl_editor->e_xwas, x->gl_editor->e_ywas,
                &x11, &y11, &x12, &y12)))
        {
            int wantwidth = xpos - x11;
            t_object *ob = pd_checkobject(&y1->g_pd);
            if (ob && ((ob->te_pd->c_wb == &text_widgetbehavior) ||
                ob->te_type == T_ATOM ||
                    (pd_checkglist(&ob->te_pd) &&
                     !((t_canvas *)ob)->gl_isgraph)))
            {
                int fwidth, fheight, guifsize;
                text_getfont(ob, x, &fwidth, &fheight, &guifsize);
                wantwidth = wantwidth / fwidth;
                if (wantwidth < 1)
                    wantwidth = 1;
                ob->te_width = wantwidth;
                gobj_vis(y1, x, 0);
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else if (ob && ob->ob_pd == canvas_class)
            {
                gobj_vis(y1, x, 0);
                ((t_canvas *)ob)->gl_pixwidth += xpos - x->gl_editor->e_xnew;
                ((t_canvas *)ob)->gl_pixheight += ypos - x->gl_editor->e_ynew;
                x->gl_editor->e_xnew = xpos;
                x->gl_editor->e_ynew = ypos;
                canvas_fixlinesfor(x, ob);
                gobj_vis(y1, x, 1);
            }
            else post("not resizable");
        }
    }
    else canvas_doclick(x, xpos, ypos, 0, mod, 0);

    x->gl_editor->e_lastmoved = 1;
}